

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O0

int32_t __thiscall
aeron::concurrent::logbuffer::ExclusiveTermAppender::appendUnfragmentedMessage
          (ExclusiveTermAppender *this,int32_t termId,int32_t termOffset,HeaderWriter *header,
          AtomicBuffer *srcBuffer,index_t srcOffset,index_t length,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  uint value;
  int iVar1;
  index_t termLength_00;
  long v;
  int64_t reservedValue;
  int32_t resultingOffset;
  int32_t termLength;
  index_t alignedLength;
  index_t frameLength;
  index_t srcOffset_local;
  AtomicBuffer *srcBuffer_local;
  HeaderWriter *header_local;
  int32_t termOffset_local;
  int32_t termId_local;
  ExclusiveTermAppender *this_local;
  
  value = length + 0x20;
  iVar1 = util::BitUtil::align<int>(value,0x20);
  termLength_00 = AtomicBuffer::capacity(this->m_termBuffer);
  reservedValue._4_4_ = termOffset + iVar1;
  putRawTailOrdered(this,(long)termId,reservedValue._4_4_);
  if (termLength_00 < reservedValue._4_4_) {
    reservedValue._4_4_ =
         handleEndOfLogCondition(this->m_termBuffer,termId,termOffset,header,termLength_00);
  }
  else {
    HeaderWriter::write(header,(int)this->m_termBuffer,(void *)(ulong)(uint)termOffset,(ulong)value)
    ;
    AtomicBuffer::putBytes(this->m_termBuffer,termOffset + 0x20,srcBuffer,srcOffset,length);
    v = std::function<long_(aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
                  (reservedValueSupplier,this->m_termBuffer,termOffset,value);
    AtomicBuffer::putInt64(this->m_termBuffer,termOffset + 0x18,v);
    FrameDescriptor::frameLengthOrdered(this->m_termBuffer,termOffset,value);
  }
  return reservedValue._4_4_;
}

Assistant:

inline std::int32_t appendUnfragmentedMessage(
        std::int32_t termId,
        std::int32_t termOffset,
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        const util::index_t frameLength = length + DataFrameHeader::LENGTH;
        const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

        const std::int32_t termLength = m_termBuffer.capacity();

        std::int32_t resultingOffset = termOffset + alignedLength;
        putRawTailOrdered(termId, resultingOffset);

        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termId, termOffset, header, termLength);
        }
        else
        {
            header.write(m_termBuffer, termOffset, frameLength, termId);
            m_termBuffer.putBytes(termOffset + DataFrameHeader::LENGTH, srcBuffer, srcOffset, length);

            const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, termOffset, frameLength);
            m_termBuffer.putInt64(termOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

            FrameDescriptor::frameLengthOrdered(m_termBuffer, termOffset, frameLength);
        }

        return resultingOffset;
    }